

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int gpioNotifyOpenWithSize(int bufSize)

{
  FILE *__stream;
  int __fd;
  int iVar1;
  uint32_t uVar2;
  ulong uVar3;
  int iVar4;
  gpioNotify_t *pgVar5;
  char name [32];
  char acStack_48 [40];
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioNotifyOpenWithSize_cold_1();
  }
  if (libInitialised == '\0') {
    uVar3 = 0xffffffe1;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioNotifyOpenWithSize_cold_2();
    }
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)notifyMutex_mutex);
    pgVar5 = gpioNotify;
    uVar3 = 0;
    do {
      if (pgVar5->state == 0) {
        pgVar5->state = 1;
        pthread_mutex_unlock((pthread_mutex_t *)notifyMutex_mutex);
        sprintf(acStack_48,"/dev/pigpio%d",uVar3 & 0xffffffff);
        myCreatePipe(acStack_48,0x1b4);
        __fd = open(acStack_48,0x802);
        if (__fd < 0) {
          pgVar5->state = 0;
          uVar3 = 0xffffffe9;
          if ((gpioCfg.internals >> 10 & 1) == 0) {
            gpioNotifyOpenWithSize_cold_4();
          }
        }
        else {
          iVar4 = (int)uVar3;
          if ((bufSize == 0) ||
             (iVar1 = fcntl(__fd,0x407,bufSize), iVar4 = bufSize, iVar1 == bufSize)) {
            pgVar5->seqno = 0;
            pgVar5->bits = 0;
            pgVar5->fd = __fd;
            pgVar5->pipe = 1;
            pgVar5->max_emits = 0x155;
            uVar2 = gpioTick();
            pgVar5->lastReportTick = uVar2;
            gpioNotify[iVar4].state = 3;
            closeOrphanedNotifications((int)uVar3,__fd);
          }
          else {
            pgVar5->state = 0;
            __stream = _stderr;
            uVar3 = 0xffffffe9;
            if ((gpioCfg.internals >> 10 & 1) == 0) {
              myTimeStamp();
              fprintf(__stream,"%s %s: fcntl %s size %d failed (%m)\n",myTimeStamp::buf,
                      "gpioNotifyOpenWithSize",acStack_48,bufSize);
            }
          }
        }
        goto LAB_0011e92c;
      }
      uVar3 = uVar3 + 1;
      pgVar5 = pgVar5 + 1;
    } while (uVar3 != 0x20);
    pthread_mutex_unlock((pthread_mutex_t *)notifyMutex_mutex);
    uVar3 = 0xffffffe8;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioNotifyOpenWithSize_cold_3();
    }
  }
LAB_0011e92c:
  return (int)uVar3;
}

Assistant:

int gpioNotifyOpenWithSize(int bufSize)
{
   int i, slot, fd;
   char name[32];

   DBG(DBG_USER, "bufSize=%d", bufSize);

   CHECK_INITED;

   slot = -1;

   notifyMutex(1);

   for (i=0; i<PI_NOTIFY_SLOTS; i++)
   {
      if (gpioNotify[i].state == PI_NOTIFY_CLOSED)
      {
         slot = i;
         gpioNotify[slot].state = PI_NOTIFY_RESERVED;
         break;
      }
   }

   notifyMutex(0);

   if (slot < 0) SOFT_ERROR(PI_NO_HANDLE, "no handle");

   sprintf(name, "/dev/pigpio%d", slot);

   myCreatePipe(name, 0664);

   fd = open(name, O_RDWR|O_NONBLOCK);

   if (fd < 0)
   {
      gpioNotify[slot].state = PI_NOTIFY_CLOSED;
      SOFT_ERROR(PI_BAD_PATHNAME, "open %s failed (%m)", name);
   }

   if (bufSize != 0)
   {
      i = fcntl(fd, F_SETPIPE_SZ, bufSize);
      if (i != bufSize)
      {
         gpioNotify[slot].state = PI_NOTIFY_CLOSED;
         SOFT_ERROR(PI_BAD_PATHNAME,
            "fcntl %s size %d failed (%m)", name, bufSize);
      }
   }

   gpioNotify[slot].seqno = 0;
   gpioNotify[slot].bits  = 0;
   gpioNotify[slot].fd    = fd;
   gpioNotify[slot].pipe  = 1;
   gpioNotify[slot].max_emits  = MAX_EMITS;
   gpioNotify[slot].lastReportTick = gpioTick();
   gpioNotify[i].state = PI_NOTIFY_OPENED;

   closeOrphanedNotifications(slot, fd);

   return slot;
}